

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count128_lcg_shift.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,status_type *S)

{
  undefined4 uVar1;
  uint128 value;
  ostream *this;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  undefined1 in_stack_ffffffffffffffd8 [14];
  char cVar3;
  char in_stack_ffffffffffffffe7;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  cVar3 = '(';
  this = std::__ostream_insert<char,std::char_traits<char>>(out,&stack0xffffffffffffffe6,1);
  value.value._14_1_ = cVar3;
  value.value._0_14_ = in_stack_ffffffffffffffd8;
  value.value._15_1_ = in_stack_ffffffffffffffe7;
  pbVar2 = impl::operator<<((impl *)this,
                            *(basic_ostream<char,_std::char_traits<char>_> **)&(S->r).value,value);
  std::__ostream_insert<char,std::char_traits<char>>(pbVar2,&stack0xffffffffffffffe7,1);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const status_type &S) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << S.r << ')';
        out.flags(flags);
        return out;
      }